

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluContextInfo.cpp
# Opt level: O1

bool __thiscall glu::ES2ContextInfo::isFragmentUniformLoopSupported(ES2ContextInfo *this)

{
  bool bVar1;
  
  if ((this->m_fragmentUniformLoopsSupported).m_isComputed == false) {
    bVar1 = TryCompileProgram::operator()
                      (&(this->m_fragmentUniformLoopsSupported).m_compute,
                       (this->super_ContextInfo).m_context);
    (this->m_fragmentUniformLoopsSupported).m_value = bVar1;
    (this->m_fragmentUniformLoopsSupported).m_isComputed = true;
  }
  return (this->m_fragmentUniformLoopsSupported).m_value;
}

Assistant:

bool								isFragmentUniformLoopSupported		(void) const	{ return m_fragmentUniformLoopsSupported.getValue(m_context);	}